

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

void __thiscall subprocess::detail::Streams::setup_comm_channels(Streams *this)

{
  long lVar1;
  const_iterator pp_Var2;
  long in_RDI;
  long in_FS_OFFSET;
  _IO_FILE **h;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<_IO_FILE_*> *__range2;
  initializer_list<_IO_FILE_*> handles;
  Streams *in_stack_ffffffffffffff98;
  initializer_list<_IO_FILE_*> *in_stack_ffffffffffffffa8;
  const_iterator local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x30) != -1) {
    fdopen(*(int *)(in_RDI + 0x30),"wb");
    input(in_stack_ffffffffffffff98,(FILE *)0x82a4fc);
  }
  if (*(int *)(in_RDI + 0x3c) != -1) {
    fdopen(*(int *)(in_RDI + 0x3c),"rb");
    output(in_stack_ffffffffffffff98,(FILE *)0x82a528);
  }
  if (*(int *)(in_RDI + 0x44) != -1) {
    fdopen(*(int *)(in_RDI + 0x44),"rb");
    error(in_stack_ffffffffffffff98,(FILE *)0x82a554);
  }
  input(in_stack_ffffffffffffff98);
  output(in_stack_ffffffffffffff98);
  error(in_stack_ffffffffffffff98);
  local_48 = std::initializer_list<_IO_FILE_*>::begin
                       ((initializer_list<_IO_FILE_*> *)in_stack_ffffffffffffff98);
  pp_Var2 = std::initializer_list<_IO_FILE_*>::end(in_stack_ffffffffffffffa8);
  for (; local_48 != pp_Var2; local_48 = local_48 + 1) {
    if (*local_48 != (_IO_FILE *)0x0) {
      setvbuf((FILE *)*local_48,(char *)0x0,2,0x2000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void Streams::setup_comm_channels()
  {
#ifdef __USING_WINDOWS__
    util::configure_pipe(&this->g_hChildStd_IN_Rd, &this->g_hChildStd_IN_Wr, &this->g_hChildStd_IN_Wr);
    this->input(util::file_from_handle(this->g_hChildStd_IN_Wr, "w"));
    this->write_to_child_ = _fileno(this->input());

    util::configure_pipe(&this->g_hChildStd_OUT_Rd, &this->g_hChildStd_OUT_Wr, &this->g_hChildStd_OUT_Rd);
    this->output(util::file_from_handle(this->g_hChildStd_OUT_Rd, "r"));
    this->read_from_child_ = _fileno(this->output());

    util::configure_pipe(&this->g_hChildStd_ERR_Rd, &this->g_hChildStd_ERR_Wr, &this->g_hChildStd_ERR_Rd);
    this->error(util::file_from_handle(this->g_hChildStd_ERR_Rd, "r"));
    this->err_read_ = _fileno(this->error());
#else

    if (write_to_child_ != -1)  input(fdopen(write_to_child_, "wb"));
    if (read_from_child_ != -1) output(fdopen(read_from_child_, "rb"));
    if (err_read_ != -1)        error(fdopen(err_read_, "rb"));

    auto handles = {input(), output(), error()};

    for (auto& h : handles) {
      if (h == nullptr) continue;
      setvbuf(h, nullptr, _IONBF, BUFSIZ);
    }
  #endif
  }